

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOManager.cpp
# Opt level: O0

Mat * IOManager::secret_share_kv_data(int *data,int size,string *prefix,bool isFreq)

{
  undefined1 v [16];
  Mat *pMVar1;
  ostream *poVar2;
  void *this;
  undefined8 *puVar3;
  reference pvVar4;
  ll lVar5;
  reference pvVar6;
  size_type *psVar7;
  byte in_CL;
  string *in_RDX;
  int in_ESI;
  long in_RDI;
  ll tmp;
  int k;
  int j_1;
  int i_1;
  int j;
  string filename;
  int i;
  Mat *res;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  out_files;
  vector<long_long,_std::allocator<long_long>_> coefficients;
  Mat *in_stack_fffffffffffffdf0;
  undefined1 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  Mat *in_stack_fffffffffffffe08;
  vector<long_long,_std::allocator<long_long>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  ostream *in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe38;
  int __val;
  Mat *local_1a8;
  undefined1 local_150 [24];
  longlong local_138;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  Mat *local_78;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_68 [2];
  vector<long_long,_std::allocator<long_long>_> local_38;
  byte local_19;
  int local_c;
  long local_8;
  
  local_19 = in_CL & 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::allocator<long_long>::allocator((allocator<long_long> *)0x137826);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
             (allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<long_long>::~allocator((allocator<long_long> *)0x13784f);
  std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::allocator
            ((allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x137864);
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
           (allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::~allocator
            ((allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x13788d);
  poVar2 = std::operator<<((ostream *)&std::cout,in_RDX);
  poVar2 = std::operator<<(poVar2," size: ");
  this = (void *)std::ostream::operator<<(poVar2,local_c);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  puVar3 = (undefined8 *)operator_new__(0x80);
  *puVar3 = 3;
  local_78 = (Mat *)(puVar3 + 1);
  pMVar1 = local_78;
  do {
    local_1a8 = pMVar1;
    Mat::Mat(in_stack_fffffffffffffdf0);
    pMVar1 = local_1a8 + 1;
  } while (local_1a8 + 1 != (Mat *)(puVar3 + 0x10));
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    Mat::init(local_78 + local_7c,(EVP_PKEY_CTX *)0x1);
    std::operator+((char *)in_stack_fffffffffffffe38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe30);
    __val = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::__cxx11::to_string(__val);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    in_stack_fffffffffffffe38 = std::operator<<((ostream *)&std::cout,"File: ");
    in_stack_fffffffffffffe30 = std::operator<<(in_stack_fffffffffffffe38,local_a0);
    std::ostream::operator<<(in_stack_fffffffffffffe30,std::endl<char,std::char_traits<char>>);
    pvVar4 = std::
             vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ::operator[](local_68,(long)local_7c);
    std::ofstream::open((string *)pvVar4,(_Ios_Openmode)local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  for (local_124 = 1; local_124 < 2; local_124 = local_124 + 1) {
    lVar5 = Constant::Util::randomlong();
    pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       (&local_38,(long)local_124);
    *pvVar6 = lVar5;
  }
  for (local_128 = 0; pMVar1 = local_78, local_128 < local_c; local_128 = local_128 + 1) {
    for (local_12c = 1; local_12c < 2; local_12c = local_12c + 1) {
      in_stack_fffffffffffffe10 =
           (vector<long_long,_std::allocator<long_long>_> *)Constant::Util::randomlong();
      pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&local_38,(long)local_12c);
      *pvVar6 = (value_type)in_stack_fffffffffffffe10;
    }
    if ((local_19 & 1) == 0) {
      in_stack_fffffffffffffe08 = (Mat *)(long)(*(int *)(local_8 + (long)local_128 * 4) << 0x14);
      psVar7 = (size_type *)
               std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_38,0);
      *psVar7 = (size_type)in_stack_fffffffffffffe08;
    }
    else if (*(int *)(local_8 + (long)local_128 * 4) < 1) {
      pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_38,0);
      *pvVar6 = 0;
    }
    else {
      pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_38,0);
      *pvVar6 = 0x100000;
    }
    for (local_130 = 0; local_130 < 3; local_130 = local_130 + 1) {
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)local_1a8,
                 (vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe38);
      puVar8 = local_150;
      lVar5 = poly_eval(in_stack_fffffffffffffe10,(ll)in_stack_fffffffffffffe08);
      std::vector<long_long,_std::allocator<long_long>_>::~vector
                ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe00);
      local_138 = lVar5;
      pvVar4 = std::
               vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               ::operator[](local_68,(long)local_130);
      in_stack_fffffffffffffe00 = (ostream *)std::ostream::operator<<(pvVar4,local_138);
      std::operator<<(in_stack_fffffffffffffe00,",");
      v._8_8_ = lVar5;
      v._0_8_ = puVar8;
      Mat::setVal(in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20),(ll128)v
                 );
    }
  }
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)in_stack_fffffffffffffe00);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe00);
  return pMVar1;
}

Assistant:

Mat* IOManager::secret_share_kv_data(int* data, int size, string prefix, bool isFreq) {
    vector<ll> coefficients(TN);
    vector<ofstream> out_files(M);
    cout << prefix << " size: " << size << endl;

    Mat* res = new Mat[M];
//    Mat res(1, size);
    for (int i = 0; i < M; ++i) {
        res[i].init(1, size);
        string filename = "output/"+prefix+"_"+to_string(i)+".csv";
        cout << "File: " << filename << endl;
        out_files[i].open(filename, ios::out);
    }
    /// 简化计算，TODO，delete
    for (int j = 1; j < TN; ++j) {
        coefficients[j] = Constant::Util::randomlong();
    }
//    for (int j = 0; j < TN; ++j) {
//        cout << j << ": " << coefficients[j] << endl;
//    }
    for (int i = 0; i < size; ++i) {
        for (int j = 1; j < TN; ++j) {
            coefficients[j] = Constant::Util::randomlong();
        }
        if (isFreq) {
            if (data[i] > 0) {
                coefficients[0] = IE;
            } else {
                coefficients[0] = 0;
            }
        } else {
            coefficients[0] = data[i] * IE;
        }

        for (int k = 0; k < M; ++k) {
            ll tmp = poly_eval(coefficients, k + 2);
            out_files[k] << tmp << ",";
            res[k].setVal(i, tmp);
//            if(k==node_type){
//                res.setVal(i, tmp);
//            }
        }
//        for (int l = 0; l < TN; ++l) {
//            DBGprint("%lld, ", coefficients[l]);
//        }
//        cout << endl;
    }
//    res[0].print();
    return res;
}